

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O0

void __thiscall
DynamicKReach::update_insert
          (DynamicKReach *this,vertex_t v,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  byte bVar2;
  value_type vVar3;
  bool bVar4;
  byte *pbVar5;
  reference puVar6;
  reference pvVar7;
  uint *t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  value_type d;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  vertex_t v_local;
  DynamicKReach *this_local;
  
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
  bVar1 = *pbVar5;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in);
  s = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&s), bVar4) {
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6);
    if (*pbVar5 < this->k_) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6);
      bVar2 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
      if (bVar2 + 1 < (uint)*pbVar5) {
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6)
        ;
        vVar3 = *pvVar7;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
        *pvVar7 = vVar3 + '\x01';
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
  if (*pbVar5 < this->k_) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
    if (*pbVar5 < bVar1) {
      resume_bfs(this,v,dist);
    }
    else {
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(out);
      t = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(out);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&t), bVar4) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
        bVar1 = *pbVar5;
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6)
        ;
        if (bVar1 + 1 < (uint)*pbVar5) {
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
          vVar3 = *pvVar7;
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar6);
          *pvVar7 = vVar3 + '\x01';
          resume_bfs(this,*puVar6,dist);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::update_insert(vertex_t v, const std::vector<vertex_t> &out, const std::vector<vertex_t> &in,
                                  std::vector<distance_t> &dist) {
    auto d = dist.at(v);
    for (const auto &s : in){
        if (dist.at(s) < k_ && dist.at(s) + 1 < dist.at(v)){
            dist.at(v) = dist.at(s) + 1;
        }
    }

    if (dist.at(v) >= k_){
        return;
    }

    if (dist.at(v) < d){
        resume_bfs(v, dist);
    }
    else {
        for (const auto &t : out) {
            if (dist.at(v) + 1 < dist.at(t)){
                dist.at(t) = dist.at(v) + 1;
                resume_bfs(t, dist);
            }
        }
    }
}